

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOutputGroup(Gia_Man_t *p,int iOutStart,int iOutStop)

{
  int nObjsMax;
  Gia_Man_t *pNew_00;
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int iOutStop_local;
  int iOutStart_local;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  nObjsMax = Gia_ManObjNum(p);
  pNew_00 = Gia_ManStart(nObjsMax);
  pcVar1 = Abc_UtilStrsav(p->pName);
  pNew_00->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  pNew_00->pSpec = pcVar1;
  pGVar2 = Gia_ManConst0(p);
  pGVar2->Value = 0;
  for (local_2c = iOutStart; local_2c < iOutStop; local_2c = local_2c + 1) {
    pGVar2 = Gia_ManCo(p,local_2c);
    Gia_ManDupOrderDfs_rec(pNew_00,p,pGVar2);
  }
  return pNew_00;
}

Assistant:

Gia_Man_t * Gia_ManDupOutputGroup( Gia_Man_t * p, int iOutStart, int iOutStop )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = iOutStart; i < iOutStop; i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    }
    return pNew;
}